

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O3

uint __thiscall
QFragmentMapData<QTextBlockData>::insert_single
          (QFragmentMapData<QTextBlockData> *this,int key,uint length)

{
  int *piVar1;
  uint uVar2;
  uint x;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  Header *pHVar7;
  uint uVar8;
  uint uVar9;
  
  x = createFragment(this);
  uVar3 = (ulong)x;
  lVar4 = 0;
  *(undefined4 *)((long)(this->field_0).head + uVar3 * 0x48 + 4) = 0;
  *(undefined4 *)((long)(this->field_0).head + uVar3 * 0x48 + 8) = 0;
  (this->field_0).fragments[uVar3].super_QFragment<3>.size_array[0] = length;
  do {
    *(undefined4 *)((long)(this->field_0).head + lVar4 * 4 + uVar3 * 0x48 + 0x20) = 1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  lVar4 = 0;
  do {
    *(undefined4 *)((long)(this->field_0).head + lVar4 * 4 + uVar3 * 0x48 + 0x10) = 0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pHVar7 = (this->field_0).head;
  uVar2 = pHVar7->root;
  if (pHVar7->root == 0) {
    *(undefined4 *)((long)pHVar7 + uVar3 * 0x48) = 0;
    ((this->field_0).head)->root = x;
  }
  else {
    do {
      uVar8 = uVar2;
      uVar9 = key;
      uVar6 = (ulong)uVar8;
      uVar5 = *(uint *)((long)pHVar7 + uVar6 * 0x48 + 0x10);
      lVar4 = 4;
      key = uVar9;
      if (uVar5 < uVar9) {
        key = uVar9 - (*(int *)((long)pHVar7 + uVar6 * 0x48 + 0x1c) + uVar5);
        lVar4 = 8;
      }
      uVar2 = *(uint *)((long)pHVar7 + lVar4 + uVar6 * 0x48);
    } while (uVar2 != 0);
    *(uint *)((long)pHVar7 + uVar3 * 0x48) = uVar8;
    if (uVar5 < uVar9) {
      *(uint *)((long)(this->field_0).head + uVar6 * 0x48 + 8) = x;
    }
    else {
      *(uint *)((long)(this->field_0).head + uVar6 * 0x48 + 4) = x;
      lVar4 = 0;
      do {
        *(undefined4 *)((long)(this->field_0).head + lVar4 * 4 + uVar6 * 0x48 + 0x10) =
             *(undefined4 *)((long)(this->field_0).head + lVar4 * 4 + uVar3 * 0x48 + 0x1c);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
    pHVar7 = (this->field_0).head;
    uVar2 = *(uint *)((long)pHVar7 + uVar6 * 0x48);
    if (uVar2 != 0) {
      do {
        uVar5 = uVar2;
        uVar6 = (ulong)uVar5;
        if (*(uint *)((long)pHVar7 + uVar6 * 0x48 + 4) == uVar8) {
          lVar4 = 0;
          do {
            piVar1 = (int *)((long)(this->field_0).head + lVar4 * 4 + uVar6 * 0x48 + 0x10);
            *piVar1 = *piVar1 + *(int *)((long)(this->field_0).head +
                                        lVar4 * 4 + uVar3 * 0x48 + 0x1c);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 3);
        }
        pHVar7 = (this->field_0).head;
        uVar2 = *(uint *)((long)pHVar7 + uVar6 * 0x48);
        uVar8 = uVar5;
      } while (uVar2 != 0);
    }
  }
  rebalance(this,x);
  return x;
}

Assistant:

uint QFragmentMapData<Fragment>::insert_single(int key, uint length)
{
    Q_ASSERT(!findNode(key) || (int)this->position(findNode(key)) == key);

    uint z = createFragment();

    F(z).left = 0;
    F(z).right = 0;
    F(z).size_array[0] = length;
    for (uint field = 1; field < Fragment::size_array_max; ++field)
        F(z).size_array[field] = 1;
    for (uint field = 0; field < Fragment::size_array_max; ++field)
        F(z).size_left_array[field] = 0;

    uint y = 0;
    uint x = root();

    Q_ASSERT(!x || F(x).parent == 0);

    uint s = key;
    bool right = false;
    while (x) {
        y = x;
        if (s <= F(x).size_left_array[0]) {
            x = F(x).left;
            right = false;
        } else {
            s -= F(x).size_left_array[0] + F(x).size_array[0];
            x = F(x).right;
            right = true;
        }
    }

    F(z).parent = y;
    if (!y) {
        head->root = z;
    } else if (!right) {
        F(y).left = z;
        for (uint field = 0; field < Fragment::size_array_max; ++field)
            F(y).size_left_array[field] = F(z).size_array[field];
    } else {
        F(y).right = z;
    }
    while (y && F(y).parent) {
        uint p = F(y).parent;
        if (F(p).left == y) {
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] += F(z).size_array[field];
        }
        y = p;
    }
    rebalance(z);

    return z;
}